

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

ALCdevice *
alcCaptureOpenDevice(ALCchar *devicename,ALCuint frequency,ALCenum format,ALCsizei buffersize)

{
  ALCdevice AVar1;
  ALCchar *pAVar2;
  ALCdevice *local_50;
  ALCchar *alcstr;
  ALCdevice *pAStack_38;
  ALCint alci;
  ALCdevice *retval;
  DeviceWrapper *device;
  ALCenum local_20;
  ALCsizei buffersize_local;
  ALCenum format_local;
  ALCuint frequency_local;
  ALCchar *devicename_local;
  
  device._4_4_ = buffersize;
  local_20 = format;
  buffersize_local = frequency;
  _format_local = devicename;
  retval = (ALCdevice *)calloc(1,0x838);
  if (retval == (ALCdevice *)0x0) {
    devicename_local = (ALCchar *)0x0;
  }
  else {
    APILOCK();
    IO_ENTRYINFO(ALEE_alcCaptureOpenDevice);
    IO_STRING(_format_local);
    IO_UINT32(buffersize_local);
    IO_ALCENUM(local_20);
    IO_ALSIZEI(device._4_4_);
    pAStack_38 = (*REAL_alcCaptureOpenDevice)(_format_local,buffersize_local,local_20,device._4_4_);
    if (pAStack_38 == (ALCdevice *)0x0) {
      local_50 = (ALCdevice *)0x0;
    }
    else {
      local_50 = retval;
    }
    IO_PTR(local_50);
    if (pAStack_38 == (ALCdevice *)0x0) {
      free(retval);
    }
    else {
      alcstr._4_4_ = 0;
      *(ALCdevice **)retval = pAStack_38;
      retval[0xc] = (ALCdevice)0x1;
      retval[0xd] = (ALCdevice)0x1;
      AVar1 = (ALCdevice)(*REAL_alcIsExtensionPresent)(*(ALCdevice **)retval,"ALC_EXT_disconnect");
      retval[0xe] = AVar1;
      if (local_20 == 0x1100) {
        *(undefined4 *)(retval + 0x14) = 1;
      }
      else if (local_20 == 0x1101) {
        *(undefined4 *)(retval + 0x14) = 2;
      }
      else if (local_20 == 0x1102) {
        *(undefined4 *)(retval + 0x14) = 2;
      }
      else if (local_20 == 0x1103) {
        *(undefined4 *)(retval + 0x14) = 4;
      }
      *(DeviceWrapper **)(retval + 0x830) = null_device.next;
      *(DeviceWrapper **)(retval + 0x828) = &null_device;
      null_device.next = (DeviceWrapper *)retval;
      if (*(long *)(retval + 0x830) != 0) {
        *(ALCdevice **)(*(long *)(retval + 0x830) + 0x828) = retval;
      }
      (*REAL_alcGetIntegerv)(*(ALCdevice **)retval,0x1000,1,(ALCint *)((long)&alcstr + 4));
      IO_INT32(alcstr._4_4_);
      (*REAL_alcGetIntegerv)(*(ALCdevice **)retval,0x1001,1,(ALCint *)((long)&alcstr + 4));
      IO_INT32(alcstr._4_4_);
      pAVar2 = (*REAL_alcGetString)(*(ALCdevice **)retval,0x310);
      IO_STRING(pAVar2);
      pAVar2 = (*REAL_alcGetString)(*(ALCdevice **)retval,0x1006);
      IO_STRING(pAVar2);
    }
    check_alc_error_events((DeviceWrapper *)retval);
    check_al_async_states();
    APIUNLOCK();
    devicename_local = (ALCchar *)retval;
  }
  return (ALCdevice *)devicename_local;
}

Assistant:

ALCdevice *alcCaptureOpenDevice(const ALCchar *devicename, ALCuint frequency, ALCenum format, ALCsizei buffersize)
{
    DeviceWrapper *device = (DeviceWrapper *) calloc(1, sizeof (DeviceWrapper));
    ALCdevice *retval;

    if (!device) {
        return NULL;
    }

    IO_START(alcCaptureOpenDevice);
    IO_STRING(devicename);
    IO_UINT32(frequency);
    IO_ALCENUM(format);
    IO_ALSIZEI(buffersize);
    retval = REAL_alcCaptureOpenDevice(devicename, frequency, format, buffersize);
    IO_PTR(retval ? device : NULL);

    if (!retval) {
        free(device);
    } else {
        ALCint alci = 0;
        const ALCchar *alcstr;

        device->device = retval;
        device->iscapture = ALC_TRUE;
        device->connected = ALC_TRUE;
        device->supports_disconnect_ext = REAL_alcIsExtensionPresent(device->device, "ALC_EXT_disconnect");
        if (format == AL_FORMAT_MONO8) {
            device->samplesize = 1;
        } else if (format == AL_FORMAT_MONO16) {
            device->samplesize = 2;
        } else if (format == AL_FORMAT_STEREO8) {
            device->samplesize = 2;
        } else if (format == AL_FORMAT_STEREO16) {
            device->samplesize = 4;
            // !!! FIXME: float32
        }

        device->next = null_device.next;
        device->prev = &null_device;
        null_device.next = device;
        if (device->next) {
            device->next->prev = device;
        }

        REAL_alcGetIntegerv(device->device, ALC_MAJOR_VERSION, 1, &alci);
        IO_INT32(alci);
        REAL_alcGetIntegerv(device->device, ALC_MINOR_VERSION, 1, &alci);
        IO_INT32(alci);
        alcstr = REAL_alcGetString(device->device, ALC_CAPTURE_DEVICE_SPECIFIER);
        IO_STRING(alcstr);
        alcstr = REAL_alcGetString(device->device, ALC_EXTENSIONS);
        IO_STRING(alcstr);
    }

    IO_END_ALC(device);
    return (ALCdevice *) device;
}